

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic_enum.hpp
# Opt level: O2

unsigned_long magic_enum::detail::log2<unsigned_long>(unsigned_long value)

{
  unsigned_long ret;
  
  ret = 0;
  for (; 1 < value; value = value >> 1) {
    ret = ret + 1;
  }
  return ret;
}

Assistant:

constexpr I log2(I value) noexcept {
  static_assert(std::is_integral_v<I>, "magic_enum::detail::log2 requires integral type.");

  if constexpr (std::is_same_v<I, bool>) { // bool special case
    return MAGIC_ENUM_ASSERT(false), value;
  } else {
    auto ret = I{0};
    for (; value > I{1}; value >>= I{1}, ++ret) {}

    return ret;
  }
}